

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

vm_obj_id_t __thiscall
TadsHttpRequest::prep_event_obj(TadsHttpRequest *this,int *argc,int *evt_type)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  
  vVar3 = CVmObjHTTPRequest::create
                    (0,this,*(vm_obj_id_t *)
                             &(this->thread->super_TadsServerThread).listener[1].super_OS_Thread.
                              super_CVmWeakRefable.mu);
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = vVar3;
  *argc = 1;
  *evt_type = 1;
  return G_predef_X.net_request_event;
}

Assistant:

vm_obj_id_t TadsHttpRequest::prep_event_obj(VMG_ int *argc, int *evt_type)
{
    /* get the HTTPServer object that created the listener thread */
    vm_obj_id_t srv_obj = thread->get_listener()->get_server_obj();

    /* create and push the HTTPRequest object */
    G_interpreter->push_obj(
        vmg_ CVmObjHTTPRequest::create(vmg_ FALSE, this, srv_obj));

    /* we added one argument to the constructor */
    *argc = 1;

    /* the event type is NetEvRequest (1 - see include/tadsnet.h) */
    *evt_type = 1;

    /* the event subclass is NetRequestEvent */
    return G_predef->net_request_event;
}